

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

void QtPrivate::q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable*,long_long>
               (BlockVariable *first,longlong n,BlockVariable *d_first)

{
  BlockVariable *pBVar1;
  BlockVariable *in_RDX;
  long in_RSI;
  BlockVariable *in_RDI;
  long in_FS_OFFSET;
  pair<QShaderDescription::BlockVariable_*const_&,_QShaderDescription::BlockVariable_*const_&> pVar2
  ;
  BlockVariable *overlapEnd;
  BlockVariable *overlapBegin;
  pair<QShaderDescription::BlockVariable_*const_&,_QShaderDescription::BlockVariable_*const_&> pair;
  BlockVariable *d_last;
  Destructor destroyer;
  BlockVariable *in_stack_ffffffffffffff98;
  BlockVariable **in_stack_ffffffffffffffa0;
  BlockVariable *this;
  BlockVariable **in_stack_ffffffffffffffa8;
  BlockVariable *pBVar3;
  BlockVariable **local_48;
  BlockVariable **local_40;
  Destructor local_30;
  BlockVariable *local_18;
  BlockVariable *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.iter = (BlockVariable **)&DAT_aaaaaaaaaaaaaaaa;
  local_30.end = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_30.intermediate = (BlockVariable *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = in_RDX;
  local_10 = in_RDI;
  q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable*,long_long>(QShaderDescription::
  BlockVariable*,long_long,QShaderDescription::BlockVariable*)::Destructor::
  Destructor(QShaderDescription::BlockVariable___(&local_30,&local_18);
  pBVar1 = local_18 + in_RSI;
  pVar2 = std::minmax<QShaderDescription::BlockVariable*>
                    (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_48 = pVar2.first;
  pBVar3 = *local_48;
  local_40 = pVar2.second;
  this = *local_40;
  for (; local_18 != pBVar3; local_18 = local_18 + 1) {
    QShaderDescription::BlockVariable::BlockVariable(this,in_stack_ffffffffffffff98);
    local_10 = local_10 + 1;
  }
  q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable_*,_long_long>::Destructor::freeze
            (&local_30);
  for (; local_18 != pBVar1; local_18 = local_18 + 1) {
    QShaderDescription::BlockVariable::operator=(this,in_stack_ffffffffffffff98);
    local_10 = local_10 + 1;
  }
  q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable_*,_long_long>::Destructor::commit
            (&local_30);
  while (local_10 != this) {
    local_10 = local_10 + -1;
    QShaderDescription::BlockVariable::~BlockVariable(this);
  }
  q_relocate_overlap_n_left_move<QShaderDescription::BlockVariable_*,_long_long>::Destructor::
  ~Destructor((Destructor *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}